

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::texsubimage2d_neg_level(NegativeTestContext *ctx)

{
  deUint32 adVar1 [2];
  deUint32 target;
  CubeFace local_80;
  GLenum faceGL_1;
  int faceIterTcu_1;
  allocator<char> local_41;
  string local_40;
  deUint32 local_20;
  CubeFace local_1c;
  GLenum faceGL;
  int faceIterTcu;
  deUint32 textures [2];
  NegativeTestContext *ctx_local;
  
  textures = (deUint32  [2])ctx;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,&faceGL);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)textures,0xde1,faceGL);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)textures,0xde1,0,0x1907,0x20,0x20,0,0x1907,0x1401,(void *)0x0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)textures,0xde1,faceIterTcu);
  for (local_1c = CUBEFACE_NEGATIVE_X; (int)local_1c < 6; local_1c = local_1c + CUBEFACE_POSITIVE_X)
  {
    local_20 = cubeFaceToGLFace(local_1c);
    glu::CallLogWrapper::glTexImage2D
              ((CallLogWrapper *)textures,local_20,0,0x1907,0x20,0x20,0,0x1907,0x1401,(void *)0x0);
  }
  NegativeTestContext::expectError((NegativeTestContext *)textures,0);
  adVar1 = textures;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"GL_INVALID_VALUE is generated if level is less than 0.",&local_41)
  ;
  NegativeTestContext::beginSection((NegativeTestContext *)adVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glTexSubImage2D
            ((CallLogWrapper *)textures,0xde1,-1,0,0,0,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
  NegativeTestContext::endSection((NegativeTestContext *)textures);
  adVar1 = textures;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&faceIterTcu_1,"GL_INVALID_VALUE is generated if level is less than 0.",
             (allocator<char> *)((long)&faceGL_1 + 3));
  NegativeTestContext::beginSection((NegativeTestContext *)adVar1,(string *)&faceIterTcu_1);
  std::__cxx11::string::~string((string *)&faceIterTcu_1);
  std::allocator<char>::~allocator((allocator<char> *)((long)&faceGL_1 + 3));
  for (local_80 = CUBEFACE_NEGATIVE_X; (int)local_80 < 6; local_80 = local_80 + CUBEFACE_POSITIVE_X)
  {
    target = cubeFaceToGLFace(local_80);
    glu::CallLogWrapper::glTexSubImage2D
              ((CallLogWrapper *)textures,target,-1,0,0,0,0,0x1907,0x1401,(void *)0x0);
    NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
  }
  NegativeTestContext::endSection((NegativeTestContext *)textures);
  glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)textures,2,&faceGL);
  return;
}

Assistant:

void texsubimage2d_neg_level (NegativeTestContext& ctx)
{
	deUint32			textures[2];
	ctx.glGenTextures		(2, &textures[0]);
	ctx.glBindTexture		(GL_TEXTURE_2D, textures[0]);
	ctx.glTexImage2D		(GL_TEXTURE_2D, 0, GL_RGB, 32, 32, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.glBindTexture		(GL_TEXTURE_2D, textures[1]);
	FOR_CUBE_FACES(faceGL, ctx.glTexImage2D(faceGL, 0, GL_RGB, 32, 32, 0, GL_RGB, GL_UNSIGNED_BYTE, 0););
	ctx.expectError			(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE is generated if level is less than 0.");
	ctx.glTexSubImage2D(GL_TEXTURE_2D, -1, 0, 0, 0, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if level is less than 0.");
	FOR_CUBE_FACES(faceGL,
	{
		ctx.glTexSubImage2D(faceGL, -1, 0, 0, 0, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
		ctx.expectError(GL_INVALID_VALUE);
	});
	ctx.endSection();

	ctx.glDeleteTextures(2, &textures[0]);
}